

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O2

void fail(error_code eCode,char *what)

{
  ostream *poVar1;
  string local_40 [32];
  
  poVar1 = std::operator<<((ostream *)&std::cerr,what);
  poVar1 = std::operator<<(poVar1,": ");
  (*(eCode.cat_)->_vptr_error_category[4])(local_40,eCode.cat_,eCode._0_8_ & 0xffffffff);
  poVar1 = std::operator<<(poVar1,local_40);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

static void fail(beast::error_code eCode, char const* what)
{
    std::cerr << what << ": " << eCode.message() << "\n";
}